

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateGetEnumDescriptorSpecializations
          (EnumGenerator *this,Printer *printer)

{
  bool in_CL;
  string local_30;
  
  if (*(int *)(*(long *)(*(long *)((cpp *)this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    ClassName_abi_cxx11_(&local_30,(cpp *)this->descriptor_,(EnumDescriptor *)0x1,in_CL);
    io::Printer::Print(printer,
                       "template <>\ninline const EnumDescriptor* GetEnumDescriptor< $classname$>() {\n  return $classname$_descriptor();\n}\n"
                       ,"classname",&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void EnumGenerator::
GenerateGetEnumDescriptorSpecializations(io::Printer* printer) {
  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "template <>\n"
      "inline const EnumDescriptor* GetEnumDescriptor< $classname$>() {\n"
      "  return $classname$_descriptor();\n"
      "}\n",
      "classname", ClassName(descriptor_, true));
  }
}